

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateImportedGenerationObjects
          (cmGlobalGenerator *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   *exports)

{
  cmLocalGenerator *this_00;
  pointer pbVar1;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_> _Var2;
  string *t;
  pointer name;
  cmGeneratorTarget *gt;
  cmMakefile *mf_local;
  
  mf_local = mf;
  CreateGenerationObjects(this,ImportedOnly);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmMakefile**,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmMakefile*const>>
                    ((this->Makefiles).
                     super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->Makefiles).
                     super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&mf_local);
  this_00 = *(cmLocalGenerator **)
             ((long)_Var2._M_current +
             ((long)(this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_start -
             (long)(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start));
  pbVar1 = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (name = (targets->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
    gt = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
    if (gt != (cmGeneratorTarget *)0x0) {
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (exports,&gt);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateImportedGenerationObjects(
  cmMakefile* mf, const std::vector<std::string>& targets,
  std::vector<const cmGeneratorTarget*>& exports)
{
  this->CreateGenerationObjects(ImportedOnly);
  auto const mfit =
    std::find(this->Makefiles.begin(), this->Makefiles.end(), mf);
  cmLocalGenerator* lg =
    this->LocalGenerators[std::distance(this->Makefiles.begin(), mfit)];
  for (std::string const& t : targets) {
    cmGeneratorTarget* gt = lg->FindGeneratorTargetToUse(t);
    if (gt) {
      exports.push_back(gt);
    }
  }
}